

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int Gia_ManHashMux(Gia_Man_t *p,int iCtrl,int iData1,int iData0)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (p->fGiaSimple == 0) {
    uVar4 = iData1;
    if (iData1 < iData0) {
      if (iCtrl < 0) goto LAB_0020a6e8;
      iCtrl = iCtrl ^ 1;
      uVar4 = iData0;
      iData0 = iData1;
    }
    if ((int)uVar4 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    uVar3 = uVar4 & 1;
    if (uVar3 != 0) {
      if (iData0 < 0) goto LAB_0020a6e8;
      iData0 = iData0 ^ 1;
      uVar4 = uVar4 & 0x7ffffffe;
    }
    if (-1 < iCtrl) {
      uVar2 = Gia_ManHashAnd(p,iCtrl ^ 1,iData0);
      uVar4 = Gia_ManHashAnd(p,iCtrl,uVar4);
      if ((-1 < (int)uVar2) && (-1 < (int)uVar4)) {
        uVar4 = Gia_ManHashAnd(p,uVar2 ^ 1,uVar4 ^ 1);
        if ((int)uVar4 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        return uVar3 ^ uVar4 ^ 1;
      }
    }
  }
  else {
    iVar1 = Gia_ManHashAnd(p,iCtrl,iData1);
    if (-1 < iCtrl) {
      iLit1 = Gia_ManHashAnd(p,iCtrl ^ 1,iData0);
      iVar1 = Gia_ManHashOr(p,iVar1,iLit1);
      return iVar1;
    }
  }
LAB_0020a6e8:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

int Gia_ManHashMux( Gia_Man_t * p, int iCtrl, int iData1, int iData0 )  
{ 
    if ( p->fGiaSimple )
        return Gia_ManHashOr(p, Gia_ManHashAnd(p, iCtrl, iData1), Gia_ManHashAnd(p, Abc_LitNot(iCtrl), iData0) );
    else
    {
        int iTemp0, iTemp1, fCompl = 0;
        if ( iData0 > iData1 )
            iData0 ^= iData1, iData1 ^= iData0, iData0 ^= iData1, iCtrl = Abc_LitNot(iCtrl);
        if ( Abc_LitIsCompl(iData1) )
            iData0 = Abc_LitNot(iData0), iData1 = Abc_LitNot(iData1), fCompl = 1;
        iTemp0 = Gia_ManHashAnd( p, Abc_LitNot(iCtrl), iData0 );
        iTemp1 = Gia_ManHashAnd( p, iCtrl, iData1 );
        return Abc_LitNotCond( Gia_ManHashAnd( p, Abc_LitNot(iTemp0), Abc_LitNot(iTemp1) ), !fCompl );
    }
}